

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O1

void __thiscall wasm::SSAify::createNewIndexes(SSAify *this,LocalGraph *graph)

{
  LocalSet *set;
  undefined1 auVar1 [16];
  bool bVar2;
  Index IVar3;
  Type TVar4;
  Type in_R8;
  undefined1 auVar5 [8];
  undefined1 local_48 [8];
  FindAll<wasm::LocalSet> sets;
  
  FindAll<wasm::LocalSet>::FindAll((FindAll<wasm::LocalSet> *)local_48,this->func->body);
  auVar5 = local_48;
  do {
    if (auVar5 == (undefined1  [8])
                  sets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
      if (local_48 != (undefined1  [8])0x0) {
        operator_delete((void *)local_48,
                        (long)sets.list.
                              super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_48);
      }
      return;
    }
    set = *(LocalSet **)auVar5;
    bVar2 = LocalGraph::isSSA(graph,set->index);
    if (!bVar2) {
      if (this->allowMerges == false) {
        bVar2 = hasMerges(this,set,graph);
        if (bVar2) goto LAB_0093a4ed;
      }
      TVar4 = Function::getLocalType(this->func,set->index);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = TVar4.id;
      IVar3 = Builder::addVar((Builder *)this->func,(Function *)0x0,(Name)(auVar1 << 0x40),in_R8);
      set->index = IVar3;
    }
LAB_0093a4ed:
    auVar5 = (undefined1  [8])((long)auVar5 + 8);
  } while( true );
}

Assistant:

void createNewIndexes(LocalGraph& graph) {
    FindAll<LocalSet> sets(func->body);
    for (auto* set : sets.list) {
      // Indexes already in SSA form do not need to be modified - there is
      // already just one set for that index. Otherwise, use a new index, unless
      // merges are disallowed.
      if (!graph.isSSA(set->index) && (allowMerges || !hasMerges(set, graph))) {
        set->index = addLocal(func->getLocalType(set->index));
      }
    }
  }